

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O2

void __thiscall duckdb::CaseExpression::CaseExpression(CaseExpression *this)

{
  (this->super_ParsedExpression).super_BaseExpression.type = CASE_EXPR;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = CASE;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__CaseExpression_0178dcb0;
  (this->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->else_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  return;
}

Assistant:

BaseExpression(ExpressionType type, ExpressionClass expression_class)
	    : type(type), expression_class(expression_class) {
	}